

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void syntax_error(c2m_ctx_t c2m_ctx,char *expected_name)

{
  FILE *__stream;
  parse_ctx *ppVar1;
  char *pcVar2;
  
  __stream = (FILE *)c2m_ctx->options->message_file;
  if (__stream != (FILE *)0x0) {
    ppVar1 = c2m_ctx->parse_ctx;
    print_pos((FILE *)__stream,ppVar1->curr_token->pos,1);
    pcVar2 = get_token_name(c2m_ctx,(int)*(short *)ppVar1->curr_token);
    fprintf(__stream,"syntax error on %s",pcVar2);
    fprintf(__stream," (expected \'%s\'):",expected_name);
    fputc(10,__stream);
    c2m_ctx->n_errors = c2m_ctx->n_errors + 1;
  }
  return;
}

Assistant:

static void syntax_error (c2m_ctx_t c2m_ctx, const char *expected_name) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;

  FILE *f;

  if ((f = c2m_options->message_file) == NULL) return;
  print_pos (f, curr_token->pos, TRUE);
  fprintf (f, "syntax error on %s", get_token_name (c2m_ctx, curr_token->code));
  fprintf (f, " (expected '%s'):", expected_name);
#if 0
  {
    static const int context_len = 5;

    for (int i = 0; i < context_len && curr_token->code != T_EOFILE; i++) {
      fprintf (f, " %s", curr_token->repr);
    }
  }
#endif
  fprintf (f, "\n");
  n_errors++;
}